

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool testing::internal::
     MatchPrintAndExplain<std::array<unsigned_long,4ul>const,std::array<unsigned_long,4ul>const&>
               (array<unsigned_long,_4UL> *value,
               Matcher<const_std::array<unsigned_long,_4UL>_&> *matcher,
               MatchResultListener *listener)

{
  ostream **this;
  char cVar1;
  bool bVar2;
  string *psVar3;
  string *psVar4;
  ostream *poVar5;
  type_info *type;
  string *psVar6;
  undefined1 local_208 [8];
  StringMatchResultListener inner_listener;
  long local_68;
  long local_60 [2];
  string local_50;
  
  if (listener->stream_ == (ostream *)0x0) {
    inner_listener.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)0x0;
    local_208 = (undefined1  [8])&PTR__MatchResultListener_001e8a38;
    bVar2 = MatcherBase<const_std::array<unsigned_long,_4UL>_&>::MatchAndExplain
                      (&matcher->super_MatcherBase<const_std::array<unsigned_long,_4UL>_&>,value,
                       (MatchResultListener *)local_208);
    return bVar2;
  }
  this = &inner_listener.super_MatchResultListener.stream_;
  inner_listener.super_MatchResultListener._vptr_MatchResultListener =
       (_func_int **)&inner_listener.field_0x18;
  local_208 = (undefined1  [8])&PTR__StringMatchResultListener_001e8b60;
  std::__cxx11::stringstream::stringstream((stringstream *)this);
  bVar2 = MatcherBase<const_std::array<unsigned_long,_4UL>_&>::MatchAndExplain
                    (&matcher->super_MatcherBase<const_std::array<unsigned_long,_4UL>_&>,value,
                     (MatchResultListener *)local_208);
  ContainerPrinter::PrintValue<std::array<unsigned_long,4ul>,void>(value,listener->stream_);
  psVar3 = GetTypeName_abi_cxx11_
                     (&local_50,(internal *)&std::array<unsigned_long,4ul>::typeinfo,type);
  if ((string *)0x14 < local_50._M_string_length) {
    psVar6 = (string *)0x0;
    do {
      cVar1 = local_50._M_dataplus._M_p[(long)psVar6];
      if (cVar1 == '(') {
        psVar3 = psVar6;
      }
      psVar4 = psVar6;
      if ((cVar1 == '<') || (psVar4 = psVar3, cVar1 == '(')) goto LAB_00159094;
      psVar6 = (string *)((long)&(psVar6->_M_dataplus)._M_p + 1);
    } while ((string *)local_50._M_string_length != psVar6);
    psVar4 = (string *)0xffffffffffffffff;
LAB_00159094:
    if (psVar4 != (string *)0xffffffffffffffff) goto LAB_001590d6;
  }
  poVar5 = listener->stream_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (of type ",10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
LAB_001590d6:
  std::__cxx11::stringbuf::str();
  poVar5 = listener->stream_;
  if ((poVar5 != (ostream *)0x0) && (local_68 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,(char *)inner_listener._400_8_,local_68);
  }
  if ((long *)inner_listener._400_8_ != local_60) {
    operator_delete((void *)inner_listener._400_8_,local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_208 = (undefined1  [8])&PTR__StringMatchResultListener_001e8b60;
  std::__cxx11::stringstream::~stringstream((stringstream *)this);
  std::ios_base::~ios_base((ios_base *)&inner_listener.field_0x88);
  return bVar2;
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}